

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsFile.cpp
# Opt level: O0

int AdsFile::Find(AdsDevice *route,string *basePath,size_t maxdepth,ostream *os)

{
  initializer_list<Path> __l;
  bool bVar1;
  reference pvVar2;
  ostream *poVar3;
  Path *local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278 [32];
  value_type local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230 [39];
  bool local_209;
  int local_208;
  undefined1 local_204 [3];
  bool last;
  TcFileFindData parent;
  size_t depth;
  string path;
  allocator<Path> local_95 [13];
  Path *local_88;
  Path local_80;
  undefined1 local_58 [24];
  list<Path,_std::allocator<Path>_> pendingDirs;
  ostream *os_local;
  size_t maxdepth_local;
  string *basePath_local;
  AdsDevice *route_local;
  
  local_88 = &local_80;
  local_80.depth = 0;
  pendingDirs.super__List_base<Path,_std::allocator<Path>_>._M_impl._M_node._M_size = (size_t)os;
  std::__cxx11::string::string((string *)&local_80.path,(string *)basePath);
  local_58._0_8_ = &local_80;
  local_58._8_8_ = 1;
  std::allocator<Path>::allocator(local_95);
  __l._M_len = local_58._8_8_;
  __l._M_array = (iterator)local_58._0_8_;
  std::__cxx11::list<Path,_std::allocator<Path>_>::list
            ((list<Path,_std::allocator<Path>_> *)(local_58 + 0x10),__l,local_95);
  std::allocator<Path>::~allocator(local_95);
  local_288 = (Path *)local_58;
  do {
    local_288 = local_288 + -1;
    Find::Path::~Path(local_288);
  } while (local_288 != &local_80);
  do {
    bVar1 = std::__cxx11::list<Path,_std::allocator<Path>_>::empty
                      ((list<Path,_std::allocator<Path>_> *)(local_58 + 0x10));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      route_local._4_4_ = 0;
      local_208 = 1;
      break;
    }
    pvVar2 = std::__cxx11::list<Path,_std::allocator<Path>_>::front
                       ((list<Path,_std::allocator<Path>_> *)(local_58 + 0x10));
    std::__cxx11::string::string((string *)&depth,(string *)&pvVar2->path);
    pvVar2 = std::__cxx11::list<Path,_std::allocator<Path>_>::front
                       ((list<Path,_std::allocator<Path>_> *)(local_58 + 0x10));
    parent._316_8_ = pvVar2->depth;
    std::__cxx11::list<Path,_std::allocator<Path>_>::pop_front
              ((list<Path,_std::allocator<Path>_> *)(local_58 + 0x10));
    bVar1 = FindFirst(route,(TcFileFindData *)local_204,(string *)&depth);
    if (bVar1) {
      route_local._4_4_ = 0x70c;
      local_208 = 1;
    }
    else {
      poVar3 = std::operator<<((ostream *)
                               pendingDirs.super__List_base<Path,_std::allocator<Path>_>._M_impl.
                               _M_node._M_size,(string *)&depth);
      std::operator<<(poVar3,'\n');
      bVar1 = TcFileFindData::isDirectory((TcFileFindData *)local_204);
      if ((bVar1) && ((ulong)parent._316_8_ < maxdepth)) {
        std::operator+(local_230,(char *)&depth);
        bVar1 = FindFirst(route,(TcFileFindData *)local_204,local_230);
        std::__cxx11::string::~string((string *)local_230);
        local_209 = bVar1;
        while (((local_209 ^ 0xffU) & 1) != 0) {
          bVar1 = TcFileFindData::isDirectory((TcFileFindData *)local_204);
          if (bVar1) {
            local_258.depth = parent._316_8_ + 1;
            std::operator+(local_278,(char)&depth);
            std::operator+(&local_258.path,(char *)local_278);
            std::__cxx11::list<Path,_std::allocator<Path>_>::push_back
                      ((list<Path,_std::allocator<Path>_> *)(local_58 + 0x10),&local_258);
            Find::Path::~Path(&local_258);
            std::__cxx11::string::~string((string *)local_278);
          }
          else {
            poVar3 = std::operator<<((ostream *)
                                     pendingDirs.super__List_base<Path,_std::allocator<Path>_>.
                                     _M_impl._M_node._M_size,(string *)&depth);
            poVar3 = std::operator<<(poVar3,'/');
            poVar3 = std::operator<<(poVar3,(char *)(parent.nReserved1 + 4));
            std::operator<<(poVar3,'\n');
          }
          local_209 = FindNext(route,(TcFileFindData *)local_204,0,(char *)0x0);
        }
      }
      local_208 = 0;
    }
    std::__cxx11::string::~string((string *)&depth);
  } while (local_208 == 0);
  std::__cxx11::list<Path,_std::allocator<Path>_>::~list
            ((list<Path,_std::allocator<Path>_> *)(local_58 + 0x10));
  return route_local._4_4_;
}

Assistant:

int AdsFile::Find(const AdsDevice& route, const std::string& basePath, const size_t maxdepth, std::ostream& os)
{
    struct Path {
        size_t depth;
        std::string path;
    };
    std::list<struct Path> pendingDirs{{ 0, basePath} };
    while (!pendingDirs.empty()) {
        auto path = pendingDirs.front().path;
        auto depth = pendingDirs.front().depth;
        pendingDirs.pop_front();

        TcFileFindData parent;
        if (FindFirst(route, parent, path)) {
            return 1804;
        }

        // Path exists print it and prepare traversing
        os << path << '\n';

        if (parent.isDirectory() && (depth < maxdepth)) {
            // Finding files in a directory is a bit weird. We get only one entry per call and for
            // every call we pass the last found item to get the next. The first item is special.
            // To get the children of a directory we have to append '/*'to the path of the directory.
            for (auto last = FindFirst(route, parent, path + "/*"); !last; last = FindNext(route, parent)) {
                if (parent.isDirectory()) {
                    pendingDirs.push_back({depth + 1, path + '/' + parent.cFileName});
                } else {
                    os << path << '/' << parent.cFileName << '\n';
                }
            }
        }
    }
    return 0;
}